

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_node_connect(lysc_ctx *ctx,lysc_node *parent,lysc_node *node)

{
  ushort uVar1;
  lysc_module *plVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  lysc_node_notif *plVar5;
  int iVar6;
  LY_ERR LVar7;
  lysc_node **pplVar8;
  lysc_node_action **pplVar9;
  lysc_node_notif *plVar10;
  char *name;
  lysc_node_notif *plVar11;
  lysc_node *plVar12;
  lysc_node **list;
  lysc_node_action **local_40;
  lys_module *local_38;
  
  node->parent = parent;
  if (parent == (lysc_node *)0x0) {
    local_40 = (lysc_node_action **)0x0;
    if (ctx->ext == (lysc_ext_instance *)0x0) {
      plVar2 = ctx->cur_mod->compiled;
      if (node->nodetype == 0x400) {
        local_40 = (lysc_node_action **)&plVar2->notifs;
      }
      else if (node->nodetype == 0x100) {
        local_40 = &plVar2->rpcs;
      }
      else {
        local_40 = (lysc_node_action **)&plVar2->data;
      }
    }
    else {
      lyplg_ext_get_storage_p(ctx->ext,0x7760,&local_40);
    }
    pplVar9 = local_40;
    if (*local_40 != (lysc_node_action *)0x0) {
      (((*local_40)->field_0).node.prev)->next = node;
      node->prev = ((*local_40)->field_0).node.prev;
      pplVar9 = (lysc_node_action **)&((*local_40)->field_0).node.prev;
    }
    *pplVar9 = (lysc_node_action *)node;
    name = node->name;
    parent = (lysc_node *)0x0;
    goto LAB_0014862c;
  }
  uVar1 = node->nodetype;
  if (uVar1 < 0x1000) {
    if (uVar1 == 0x200) {
      pplVar8 = (lysc_node **)lysc_node_actions_p(parent);
    }
    else {
      if (uVar1 != 0x400) goto LAB_0014849e;
      pplVar8 = (lysc_node **)lysc_node_notifs_p(parent);
    }
  }
  else {
    if (uVar1 == 0x2000) {
      node->next = (lysc_node *)0x0;
      plVar12 = (lysc_node *)&parent[1].module;
LAB_0014854c:
      node->prev = plVar12;
      return LY_SUCCESS;
    }
    if (uVar1 == 0x1000) {
      if ((parent->nodetype & 0x300) == 0) {
        __assert_fail("parent->nodetype & (LYS_ACTION | LYS_RPC)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x9bb,
                      "LY_ERR lys_compile_node_connect(struct lysc_ctx *, struct lysc_node *, struct lysc_node *)"
                     );
      }
      plVar12 = (lysc_node *)&parent[2].next;
      node->next = plVar12;
      goto LAB_0014854c;
    }
LAB_0014849e:
    pplVar8 = lysc_node_child_p(parent);
  }
  if (pplVar8 == (lysc_node **)0x0) {
    __assert_fail("children",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x9cc,
                  "LY_ERR lys_compile_node_connect(struct lysc_ctx *, struct lysc_node *, struct lysc_node *)"
                 );
  }
  plVar11 = (lysc_node_notif *)*pplVar8;
  if (plVar11 != (lysc_node_notif *)0x0) {
    if ((node->flags & 0x100) == 0) {
      plVar10 = (lysc_node_notif *)(plVar11->field_0).node.prev;
      plVar3 = node->module;
      if ((plVar10->field_0).node.module == plVar3) {
LAB_001485f4:
        node->next = (plVar10->field_0).node.next;
        node->prev = (lysc_node *)plVar10;
        (plVar10->field_0).node.next = node;
        if (node->next == (lysc_node *)0x0) {
          pplVar8 = &(((lysc_node_notif *)*pplVar8)->field_0).node.prev;
        }
        else {
          pplVar8 = &node->next->prev;
        }
        goto LAB_0014861e;
      }
      local_38 = parent->module;
      plVar5 = plVar10;
      if (local_38 == plVar3) {
        for (; plVar10 = plVar11, (plVar11->field_0).node.module == plVar3;
            plVar11 = (lysc_node_notif *)(plVar11->field_0).node.next) {
        }
      }
      else {
        do {
          plVar10 = plVar5;
          plVar4 = (plVar10->field_0).node.module;
          if (((plVar4 == plVar3) || (iVar6 = strcmp(plVar4->name,plVar3->name), plVar4 == local_38)
              ) || (iVar6 < 0)) goto LAB_001485f4;
          plVar5 = (lysc_node_notif *)(plVar10->field_0).node.prev;
        } while ((plVar5->field_0).node.next != (lysc_node *)0x0);
      }
    }
    else {
      if (node->module != parent->module) {
        __assert_fail("node->module == parent->module",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x9d3,
                      "LY_ERR lys_compile_node_connect(struct lysc_ctx *, struct lysc_node *, struct lysc_node *)"
                     );
      }
      plVar10 = plVar11;
      if ((undefined1  [80])((undefined1  [80])plVar11->field_0 & (undefined1  [80])0x1000000) !=
          (undefined1  [80])0x0) {
        do {
          plVar10 = plVar11;
          if ((undefined1  [80])((undefined1  [80])plVar10->field_0 & (undefined1  [80])0x1000000)
              == (undefined1  [80])0x0) break;
          plVar11 = (lysc_node_notif *)(plVar10->field_0).node.next;
        } while (plVar11 != (lysc_node_notif *)0x0);
        goto LAB_001485f4;
      }
    }
    node->next = (lysc_node *)plVar10;
    node->prev = (plVar10->field_0).node.prev;
    (plVar10->field_0).node.prev = node;
    if (plVar10 != (lysc_node_notif *)*pplVar8) {
      pplVar8 = &node->prev->next;
    }
  }
LAB_0014861e:
  *pplVar8 = node;
  name = node->name;
LAB_0014862c:
  LVar7 = lys_compile_node_uniqness(ctx,parent,name,node);
  if (LVar7 == LY_SUCCESS) {
    return LY_SUCCESS;
  }
  return LY_EEXIST;
}

Assistant:

LY_ERR
lys_compile_node_connect(struct lysc_ctx *ctx, struct lysc_node *parent, struct lysc_node *node)
{
    struct lysc_node **children, *anchor = NULL;
    int insert_after = 0;

    node->parent = parent;

    if (parent) {
        if (node->nodetype == LYS_INPUT) {
            assert(parent->nodetype & (LYS_ACTION | LYS_RPC));
            /* input node is part of the action but link it with output */
            node->next = &((struct lysc_node_action *)parent)->output.node;
            node->prev = node->next;
            return LY_SUCCESS;
        } else if (node->nodetype == LYS_OUTPUT) {
            /* output node is part of the action but link it with input */
            node->next = NULL;
            node->prev = &((struct lysc_node_action *)parent)->input.node;
            return LY_SUCCESS;
        } else if (node->nodetype == LYS_ACTION) {
            children = (struct lysc_node **)lysc_node_actions_p(parent);
        } else if (node->nodetype == LYS_NOTIF) {
            children = (struct lysc_node **)lysc_node_notifs_p(parent);
        } else {
            children = lysc_node_child_p(parent);
        }
        assert(children);

        if (!(*children)) {
            /* first child */
            *children = node;
        } else if (node->flags & LYS_KEY) {
            /* special handling of adding keys */
            assert(node->module == parent->module);
            anchor = *children;
            if (anchor->flags & LYS_KEY) {
                while ((anchor->flags & LYS_KEY) && anchor->next) {
                    anchor = anchor->next;
                }
                /* insert after the last key */
                insert_after = 1;
            } /* else insert before anchor (at the beginning) */
        } else if ((*children)->prev->module == node->module) {
            /* last child is from the same module, keep the order and insert at the end */
            anchor = (*children)->prev;
            insert_after = 1;
        } else if (parent->module == node->module) {
            /* adding module child after some augments were connected */
            for (anchor = *children; anchor->module == node->module; anchor = anchor->next) {}
        } else {
            /* some augments are already connected and we are connecting new ones,
             * keep module name order and insert the node into the children list */
            anchor = *children;
            do {
                anchor = anchor->prev;

                /* check that we have not found the last augment node from our module or
                 * the first augment node from a "smaller" module or
                 * the first node from a local module */
                if ((anchor->module == node->module) || (strcmp(anchor->module->name, node->module->name) < 0) ||
                        (anchor->module == parent->module)) {
                    /* insert after */
                    insert_after = 1;
                    break;
                }

                /* we have traversed all the nodes, insert before anchor (as the first node) */
            } while (anchor->prev->next);
        }

        /* insert */
        if (anchor) {
            if (insert_after) {
                node->next = anchor->next;
                node->prev = anchor;
                anchor->next = node;
                if (node->next) {
                    /* middle node */
                    node->next->prev = node;
                } else {
                    /* last node */
                    (*children)->prev = node;
                }
            } else {
                node->next = anchor;
                node->prev = anchor->prev;
                anchor->prev = node;
                if (anchor == *children) {
                    /* first node */
                    *children = node;
                } else {
                    /* middle node */
                    node->prev->next = node;
                }
            }
        }

        /* check the name uniqueness (even for an only child, it may be in case) */
        if (lys_compile_node_uniqness(ctx, parent, node->name, node)) {
            return LY_EEXIST;
        }
    } else {
        /* top-level element */
        struct lysc_node **list = NULL;

        if (ctx->ext) {
            lyplg_ext_get_storage_p(ctx->ext, LY_STMT_DATA_NODE_MASK, (void ***)&list);
        } else if (node->nodetype == LYS_RPC) {
            list = (struct lysc_node **)&ctx->cur_mod->compiled->rpcs;
        } else if (node->nodetype == LYS_NOTIF) {
            list = (struct lysc_node **)&ctx->cur_mod->compiled->notifs;
        } else {
            list = &ctx->cur_mod->compiled->data;
        }
        if (!(*list)) {
            *list = node;
        } else {
            /* insert at the end of the module's top-level nodes list */
            (*list)->prev->next = node;
            node->prev = (*list)->prev;
            (*list)->prev = node;
        }

        /* check the name uniqueness on top-level */
        if (lys_compile_node_uniqness(ctx, NULL, node->name, node)) {
            return LY_EEXIST;
        }
    }

    return LY_SUCCESS;
}